

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  pointer pdVar7;
  pointer puVar8;
  int *piVar9;
  long lVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  int *piVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong local_58;
  
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    pdVar7 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = (comp.this)->feastol;
    lVar14 = 0;
    local_58 = 0;
    piVar12 = begin._M_current + 1;
    _Var11._M_current = begin._M_current;
    do {
      piVar9 = piVar12;
      iVar3 = *_Var11._M_current;
      iVar4 = _Var11._M_current[1];
      dVar2 = pdVar7[iVar4];
      if ((dVar2 <= dVar1) || (dVar1 < pdVar7[iVar3])) {
        if ((dVar1 < dVar2) || (pdVar7[iVar3] <= dVar1)) {
          puVar8 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = (comp.this)->inds[iVar4];
          uVar6 = (comp.this)->inds[iVar3];
          lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar8[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar6 * 0x38);
          lVar13 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar8[iVar4] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar5 * 0x38);
          if ((lVar10 < lVar13) ||
             ((lVar10 <= lVar13 &&
              (lVar10 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar13 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              (((ulong)uVar6 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
              ((ulong)uVar6 + 0x42d8680e260ae5b) * lVar10) <
              (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
              ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar10))))) goto LAB_00284b71;
        }
      }
      else {
LAB_00284b71:
        piVar12 = piVar9 + -1;
        _Var11._M_current[1] = iVar3;
        _Var11._M_current = begin._M_current;
        lVar10 = lVar14;
        if (piVar12 != begin._M_current) {
          do {
            iVar3 = *(begin._M_current + lVar10 + -4);
            if ((dVar2 <= dVar1) || (dVar1 < pdVar7[iVar3])) {
              _Var11._M_current = piVar12;
              if ((dVar2 <= dVar1) && (dVar1 < pdVar7[iVar3])) break;
              puVar8 = ((comp.this)->complementation).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = (comp.this)->inds[iVar4];
              uVar6 = (comp.this)->inds[iVar3];
              lVar13 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar8[iVar3] != '\0'].
                                       _M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(int)uVar6 * 0x38);
              lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar8[iVar4] != '\0'].
                                       _M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(int)uVar5 * 0x38);
              if (lVar15 <= lVar13) {
                if (lVar15 < lVar13) break;
                lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536;
                lVar13 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3;
                if ((((ulong)uVar5 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                    ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar15) <=
                    (((ulong)uVar6 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                    ((ulong)uVar6 + 0x42d8680e260ae5b) * lVar15)) {
                  _Var11._M_current = lVar10 + begin._M_current;
                  break;
                }
              }
            }
            piVar12 = piVar12 + -1;
            *(begin._M_current + lVar10) = iVar3;
            lVar10 = lVar10 + -4;
            _Var11._M_current = begin._M_current;
          } while (lVar10 != 0);
        }
        *_Var11._M_current = iVar4;
        local_58 = local_58 + ((long)piVar9 - (long)_Var11._M_current >> 2);
        if (8 < local_58) {
          return false;
        }
      }
      lVar14 = lVar14 + 4;
      piVar12 = piVar9 + 1;
      _Var11._M_current = piVar9;
    } while (piVar9 + 1 != end._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }